

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecMem.h
# Opt level: O0

void Vec_MemFreeP(Vec_Mem_t **p)

{
  Vec_Mem_t **p_local;
  
  if (*p != (Vec_Mem_t *)0x0) {
    Vec_MemFree(*p);
    *p = (Vec_Mem_t *)0x0;
  }
  return;
}

Assistant:

static inline void Vec_MemFreeP( Vec_Mem_t ** p )
{
    if ( *p == NULL )
        return;
    Vec_MemFree( *p );
    *p = NULL;
}